

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManPrintStatsShort(Gia_Man_t *p)

{
  uint uVar1;
  int level;
  Gia_Man_t *pGVar2;
  
  pGVar2 = p;
  Abc_Print((int)p,"i/o =%7d/%7d  ",(ulong)(uint)(p->vCis->nSize - p->nRegs),
            (ulong)(uint)(p->vCos->nSize - p->nRegs));
  Abc_Print((int)pGVar2,"ff =%7d  ",(ulong)(uint)p->nRegs);
  pGVar2 = p;
  uVar1 = Gia_ManAndNum(p);
  Abc_Print((int)pGVar2,"and =%8d  ",(ulong)uVar1);
  uVar1 = Gia_ManLevelNum(p);
  level = (int)p;
  Abc_Print(level,"lev =%5d  ",(ulong)uVar1);
  Abc_Print(level,"\n");
  return;
}

Assistant:

void Gia_ManPrintStatsShort( Gia_Man_t * p )
{
    Abc_Print( 1, "i/o =%7d/%7d  ", Gia_ManPiNum(p), Gia_ManPoNum(p) );
    Abc_Print( 1, "ff =%7d  ", Gia_ManRegNum(p) );
    Abc_Print( 1, "and =%8d  ", Gia_ManAndNum(p) );
    Abc_Print( 1, "lev =%5d  ", Gia_ManLevelNum(p) );
//    Abc_Print( 1, "mem =%5.2f MB", 12.0*Gia_ManObjNum(p)/(1<<20) );
    Abc_Print( 1, "\n" );
}